

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O1

void __thiscall avro::EnumParser::parse(EnumParser *this,Reader *reader,uint8_t *address)

{
  ulong uVar1;
  uint64_t input;
  int64_t iVar2;
  
  input = ReaderImpl<avro::NullValidator>::readVarInt(reader);
  iVar2 = decodeZigzag64(input);
  uVar1 = (this->mapping_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start[iVar2];
  if (uVar1 < this->readerSize_) {
    *(int *)(address + this->offset_) = (int)uVar1;
  }
  return;
}

Assistant:

virtual void parse(Reader &reader, uint8_t *address) const
    {
        size_t val = static_cast<size_t>(reader.readEnum());
        assert(static_cast<size_t>(val) < mapping_.size());

        if(mapping_[val] < readerSize_) {
            EnumRepresentation* location = reinterpret_cast<EnumRepresentation *> (address + offset_);
            *location = static_cast<EnumRepresentation>(mapping_[val]);
            DEBUG_OUT("Setting enum" << *location);
        }
    }